

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void disarm(CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  CHAR_DATA *ch_00;
  OBJ_DATA *arg1;
  CHAR_DATA *in_RSI;
  OBJ_DATA *in_RDI;
  CHAR_DATA *unaff_retaddr;
  OBJ_DATA *secondary;
  OBJ_DATA *obj;
  OBJ_DATA *in_stack_00000028;
  CHAR_DATA *in_stack_00000030;
  bool in_stack_0000007f;
  OBJ_DATA *in_stack_00000080;
  OBJ_DATA *in_stack_00000088;
  CHAR_DATA *in_stack_00000090;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  OBJ_DATA *in_stack_ffffffffffffffe0;
  
  ch_00 = (CHAR_DATA *)get_eq_char(in_RSI,0x10);
  if (ch_00 != (CHAR_DATA *)0x0) {
    bVar1 = is_obj_stat((OBJ_DATA *)ch_00,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    if ((bVar1) ||
       (bVar1 = is_obj_stat((OBJ_DATA *)ch_00,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20)),
       bVar1)) {
      act((char *)in_RSI,ch_00,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
      act((char *)in_RSI,ch_00,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
      act((char *)in_RSI,ch_00,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
    }
    else {
      act((char *)in_RSI,ch_00,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
      act((char *)in_RSI,ch_00,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
      act((char *)in_RSI,ch_00,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
      obj_from_char((OBJ_DATA *)unaff_retaddr);
      bVar1 = is_obj_stat((OBJ_DATA *)ch_00,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
      if ((bVar1) ||
         (bVar1 = is_obj_stat((OBJ_DATA *)ch_00,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20)),
         bVar1)) {
        obj_to_char(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      }
      else {
        bVar1 = check_catch((CHAR_DATA *)secondary,unaff_retaddr,in_RDI);
        if (bVar1) {
          obj_to_char(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        }
        else {
          obj_to_room((OBJ_DATA *)ch_00,in_RSI->in_room);
          bVar1 = is_npc(in_stack_ffffffffffffffd8);
          if (((bVar1) && (in_RSI->wait == 0)) &&
             (bVar1 = can_see_obj(victim,(OBJ_DATA *)CONCAT17(obj._7_1_,obj._0_7_)), bVar1)) {
            get_obj(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_0000007f);
          }
        }
      }
      arg1 = get_eq_char(in_RSI,0x12);
      if (arg1 != (OBJ_DATA *)0x0) {
        unequip_char(ch,(OBJ_DATA *)victim,obj._7_1_);
        act((char *)in_RSI,ch_00,arg1,in_stack_ffffffffffffffd8,0);
        act((char *)in_RSI,ch_00,arg1,in_stack_ffffffffffffffd8,0);
        equip_char(in_stack_00000030,in_stack_00000028,ch._4_4_,ch._3_1_);
      }
    }
  }
  return;
}

Assistant:

void disarm(CHAR_DATA *ch, CHAR_DATA *victim)
{
	OBJ_DATA *obj;
	OBJ_DATA *secondary;

	obj = get_eq_char(victim, WEAR_WIELD);

	if (obj == nullptr)
		return;

	if (is_obj_stat(obj, ITEM_NOREMOVE) || is_obj_stat(obj, ITEM_NODISARM))
	{
		act("$S weapon won't budge!", ch, nullptr, victim, TO_CHAR);
		act("$n tries to disarm you, but your weapon won't budge!", ch, nullptr, victim, TO_VICT);
		act("$n tries to disarm $N, but fails.", ch, nullptr, victim, TO_NOTVICT);
		return;
	}

	act("$n disarms you and sends your weapon flying!", ch, nullptr, victim, TO_VICT);
	act("You disarm $N!", ch, nullptr, victim, TO_CHAR);
	act("$n disarms $N!", ch, nullptr, victim, TO_NOTVICT);

	obj_from_char(obj);

	if (is_obj_stat(obj, ITEM_NODROP) || is_obj_stat(obj, ITEM_INVENTORY))
	{
		obj_to_char(obj, victim);
	}
	else
	{
		if (check_catch(ch, victim, obj))
		{
			obj_to_char(obj, ch);
		}
		else
		{
			obj_to_room(obj, victim->in_room);

			if (is_npc(victim) && victim->wait == 0 && can_see_obj(victim, obj))
				get_obj(victim, obj, nullptr, true);
		}
	}

	secondary = get_eq_char(victim, WEAR_DUAL_WIELD);

	if (secondary != nullptr)
	{
		unequip_char(victim, secondary, false);
		act("You quickly swap $p into your primary hand.", victim, secondary, 0, TO_CHAR);
		act("$n quickly swaps $p into $s primary hand.", victim, secondary, 0, TO_ROOM);
		equip_char(victim, secondary, WEAR_WIELD, false);
	}
}